

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslAttributes.cpp
# Opt level: O2

TAttributeType __thiscall
glslang::HlslParseContext::attributeFromName
          (HlslParseContext *this,TString *nameSpace,TString *name)

{
  bool bVar1;
  TAttributeType TVar2;
  
  bVar1 = std::operator==(nameSpace,"vk");
  if (bVar1) {
    bVar1 = std::operator==(name,"input_attachment_index");
    if (bVar1) {
      return EatInputAttachment;
    }
    bVar1 = std::operator==(name,"location");
    if (bVar1) {
      return EatLocation;
    }
    bVar1 = std::operator==(name,"binding");
    if (bVar1) {
      return EatBinding;
    }
    bVar1 = std::operator==(name,"global_cbuffer_binding");
    if (bVar1) {
      return EatGlobalBinding;
    }
    bVar1 = std::operator==(name,"builtin");
    if (bVar1) {
      return EatBuiltIn;
    }
    bVar1 = std::operator==(name,"constant_id");
    if (bVar1) {
      return EatConstantId;
    }
    bVar1 = std::operator==(name,"push_constant");
    if (bVar1) {
      return EatPushConstant;
    }
  }
  else {
    bVar1 = std::operator==(nameSpace,"spv");
    if (bVar1) {
      bVar1 = std::operator==(name,"format_rgba32f");
      if (bVar1) {
        return EatFormatRgba32f;
      }
      bVar1 = std::operator==(name,"format_rgba16f");
      if (bVar1) {
        return EatFormatRgba16f;
      }
      bVar1 = std::operator==(name,"format_r32f");
      if (bVar1) {
        return EatFormatR32f;
      }
      bVar1 = std::operator==(name,"format_rgba8");
      if (bVar1) {
        return EatFormatRgba8;
      }
      bVar1 = std::operator==(name,"format_rgba8snorm");
      if (bVar1) {
        return EatFormatRgba8Snorm;
      }
      bVar1 = std::operator==(name,"format_rg32f");
      if (bVar1) {
        return EatFormatRg32f;
      }
      bVar1 = std::operator==(name,"format_rg16f");
      if (bVar1) {
        return EatFormatRg16f;
      }
      bVar1 = std::operator==(name,"format_r11fg11fb10f");
      if (bVar1) {
        return EatFormatR11fG11fB10f;
      }
      bVar1 = std::operator==(name,"format_r16f");
      if (bVar1) {
        return EatFormatR16f;
      }
      bVar1 = std::operator==(name,"format_rgba16");
      if (bVar1) {
        return EatFormatRgba16;
      }
      bVar1 = std::operator==(name,"format_rgb10a2");
      if (bVar1) {
        return EatFormatRgb10A2;
      }
      bVar1 = std::operator==(name,"format_rg16");
      if (bVar1) {
        return EatFormatRg16;
      }
      bVar1 = std::operator==(name,"format_rg8");
      if (bVar1) {
        return EatFormatRg8;
      }
      bVar1 = std::operator==(name,"format_r16");
      if (bVar1) {
        return EatFormatR16;
      }
      bVar1 = std::operator==(name,"format_r8");
      if (bVar1) {
        return EatFormatR8;
      }
      bVar1 = std::operator==(name,"format_rgba16snorm");
      if (bVar1) {
        return EatFormatRgba16Snorm;
      }
      bVar1 = std::operator==(name,"format_rg16snorm");
      if (bVar1) {
        return EatFormatRg16Snorm;
      }
      bVar1 = std::operator==(name,"format_rg8snorm");
      if (bVar1) {
        return EatFormatRg8Snorm;
      }
      bVar1 = std::operator==(name,"format_r16snorm");
      if (bVar1) {
        return EatFormatR16Snorm;
      }
      bVar1 = std::operator==(name,"format_r8snorm");
      if (bVar1) {
        return EatFormatR8Snorm;
      }
      bVar1 = std::operator==(name,"format_rgba32i");
      if (bVar1) {
        return EatFormatRgba32i;
      }
      bVar1 = std::operator==(name,"format_rgba16i");
      if (bVar1) {
        return EatFormatRgba16i;
      }
      bVar1 = std::operator==(name,"format_rgba8i");
      if (bVar1) {
        return EatFormatRgba8i;
      }
      bVar1 = std::operator==(name,"format_r32i");
      if (bVar1) {
        return EatFormatR32i;
      }
      bVar1 = std::operator==(name,"format_rg32i");
      if (bVar1) {
        return EatFormatRg32i;
      }
      bVar1 = std::operator==(name,"format_rg16i");
      if (bVar1) {
        return EatFormatRg16i;
      }
      bVar1 = std::operator==(name,"format_rg8i");
      if (bVar1) {
        return EatFormatRg8i;
      }
      bVar1 = std::operator==(name,"format_r16i");
      if (bVar1) {
        return EatFormatR16i;
      }
      bVar1 = std::operator==(name,"format_r8i");
      if (bVar1) {
        return EatFormatR8i;
      }
      bVar1 = std::operator==(name,"format_rgba32ui");
      if (bVar1) {
        return EatFormatRgba32ui;
      }
      bVar1 = std::operator==(name,"format_rgba16ui");
      if (bVar1) {
        return EatFormatRgba16ui;
      }
      bVar1 = std::operator==(name,"format_rgba8ui");
      if (bVar1) {
        return EatFormatRgba8ui;
      }
      bVar1 = std::operator==(name,"format_r32ui");
      if (bVar1) {
        return EatFormatR32ui;
      }
      bVar1 = std::operator==(name,"format_rgb10a2ui");
      if (bVar1) {
        return EatFormatRgb10a2ui;
      }
      bVar1 = std::operator==(name,"format_rg32ui");
      if (bVar1) {
        return EatFormatRg32ui;
      }
      bVar1 = std::operator==(name,"format_rg16ui");
      if (bVar1) {
        return EatFormatRg16ui;
      }
      bVar1 = std::operator==(name,"format_rg8ui");
      if (bVar1) {
        return EatFormatRg8ui;
      }
      bVar1 = std::operator==(name,"format_r16ui");
      if (bVar1) {
        return EatFormatR16ui;
      }
      bVar1 = std::operator==(name,"format_r8ui");
      if (bVar1) {
        return EatFormatR8ui;
      }
      bVar1 = std::operator==(name,"nonwritable");
      if (bVar1) {
        return EatNonWritable;
      }
      bVar1 = std::operator==(name,"nonreadable");
      if (bVar1) {
        return EatNonReadable;
      }
      bVar1 = std::operator==(name,"export");
      if (bVar1) {
        return EatExport;
      }
    }
    else if (nameSpace->_M_string_length != 0) {
      return EatNone;
    }
  }
  bVar1 = std::operator==(name,"allow_uav_condition");
  if (bVar1) {
    TVar2 = EatAllow_uav_condition;
  }
  else {
    bVar1 = std::operator==(name,"branch");
    if (bVar1) {
      TVar2 = EatBranch;
    }
    else {
      bVar1 = std::operator==(name,"call");
      if (bVar1) {
        TVar2 = EatCall;
      }
      else {
        bVar1 = std::operator==(name,"domain");
        if (bVar1) {
          TVar2 = EatDomain;
        }
        else {
          bVar1 = std::operator==(name,"earlydepthstencil");
          if (bVar1) {
            TVar2 = EatEarlyDepthStencil;
          }
          else {
            bVar1 = std::operator==(name,"fastopt");
            if (bVar1) {
              TVar2 = EatFastOpt;
            }
            else {
              bVar1 = std::operator==(name,"flatten");
              if (bVar1) {
                TVar2 = EatFlatten;
              }
              else {
                bVar1 = std::operator==(name,"forcecase");
                if (bVar1) {
                  TVar2 = EatForceCase;
                }
                else {
                  bVar1 = std::operator==(name,"instance");
                  if (bVar1) {
                    TVar2 = EatInstance;
                  }
                  else {
                    bVar1 = std::operator==(name,"maxtessfactor");
                    if (bVar1) {
                      TVar2 = EatMaxTessFactor;
                    }
                    else {
                      bVar1 = std::operator==(name,"maxvertexcount");
                      if (bVar1) {
                        TVar2 = EatMaxVertexCount;
                      }
                      else {
                        bVar1 = std::operator==(name,"numthreads");
                        if (bVar1) {
                          TVar2 = EatNumThreads;
                        }
                        else {
                          bVar1 = std::operator==(name,"outputcontrolpoints");
                          if (bVar1) {
                            TVar2 = EatOutputControlPoints;
                          }
                          else {
                            bVar1 = std::operator==(name,"outputtopology");
                            if (bVar1) {
                              TVar2 = EatOutputTopology;
                            }
                            else {
                              bVar1 = std::operator==(name,"partitioning");
                              if (bVar1) {
                                TVar2 = EatPartitioning;
                              }
                              else {
                                bVar1 = std::operator==(name,"patchconstantfunc");
                                if (bVar1) {
                                  TVar2 = EatPatchConstantFunc;
                                }
                                else {
                                  bVar1 = std::operator==(name,"unroll");
                                  if (bVar1) {
                                    TVar2 = EatUnroll;
                                  }
                                  else {
                                    bVar1 = std::operator==(name,"loop");
                                    TVar2 = EatLoop;
                                    if (!bVar1) {
                                      TVar2 = EatNone;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

TAttributeType HlslParseContext::attributeFromName(const TString& nameSpace, const TString& name) const
    {
        // handle names within a namespace

        if (nameSpace == "vk") {
            if (name == "input_attachment_index")
                return EatInputAttachment;
            else if (name == "location")
                return EatLocation;
            else if (name == "binding")
                return EatBinding;
            else if (name == "global_cbuffer_binding")
                return EatGlobalBinding;
            else if (name == "builtin")
                return EatBuiltIn;
            else if (name == "constant_id")
                return EatConstantId;
            else if (name == "push_constant")
                return EatPushConstant;
        } else if (nameSpace == "spv") {
            if (name == "format_rgba32f")       return EatFormatRgba32f;
            if (name == "format_rgba16f")       return EatFormatRgba16f;
            if (name == "format_r32f")          return EatFormatR32f;
            if (name == "format_rgba8")         return EatFormatRgba8;
            if (name == "format_rgba8snorm")    return EatFormatRgba8Snorm;
            if (name == "format_rg32f")         return EatFormatRg32f;
            if (name == "format_rg16f")         return EatFormatRg16f;
            if (name == "format_r11fg11fb10f")  return EatFormatR11fG11fB10f;
            if (name == "format_r16f")          return EatFormatR16f;
            if (name == "format_rgba16")        return EatFormatRgba16;
            if (name == "format_rgb10a2")       return EatFormatRgb10A2;
            if (name == "format_rg16")          return EatFormatRg16;
            if (name == "format_rg8")           return EatFormatRg8;
            if (name == "format_r16")           return EatFormatR16;
            if (name == "format_r8")            return EatFormatR8;
            if (name == "format_rgba16snorm")   return EatFormatRgba16Snorm;
            if (name == "format_rg16snorm")     return EatFormatRg16Snorm;
            if (name == "format_rg8snorm")      return EatFormatRg8Snorm;
            if (name == "format_r16snorm")      return EatFormatR16Snorm;
            if (name == "format_r8snorm")       return EatFormatR8Snorm;
            if (name == "format_rgba32i")       return EatFormatRgba32i;
            if (name == "format_rgba16i")       return EatFormatRgba16i;
            if (name == "format_rgba8i")        return EatFormatRgba8i;
            if (name == "format_r32i")          return EatFormatR32i;
            if (name == "format_rg32i")         return EatFormatRg32i;
            if (name == "format_rg16i")         return EatFormatRg16i;
            if (name == "format_rg8i")          return EatFormatRg8i;
            if (name == "format_r16i")          return EatFormatR16i;
            if (name == "format_r8i")           return EatFormatR8i;
            if (name == "format_rgba32ui")      return EatFormatRgba32ui;
            if (name == "format_rgba16ui")      return EatFormatRgba16ui;
            if (name == "format_rgba8ui")       return EatFormatRgba8ui;
            if (name == "format_r32ui")         return EatFormatR32ui;
            if (name == "format_rgb10a2ui")     return EatFormatRgb10a2ui;
            if (name == "format_rg32ui")        return EatFormatRg32ui;
            if (name == "format_rg16ui")        return EatFormatRg16ui;
            if (name == "format_rg8ui")         return EatFormatRg8ui;
            if (name == "format_r16ui")         return EatFormatR16ui;
            if (name == "format_r8ui")          return EatFormatR8ui;

            if (name == "nonwritable")    return EatNonWritable;
            if (name == "nonreadable")    return EatNonReadable;

            if (name == "export")         return EatExport;
        } else if (nameSpace.size() > 0)
            return EatNone;

        // handle names with no namespace

        if (name == "allow_uav_condition")
            return EatAllow_uav_condition;
        else if (name == "branch")
            return EatBranch;
        else if (name == "call")
            return EatCall;
        else if (name == "domain")
            return EatDomain;
        else if (name == "earlydepthstencil")
            return EatEarlyDepthStencil;
        else if (name == "fastopt")
            return EatFastOpt;
        else if (name == "flatten")
            return EatFlatten;
        else if (name == "forcecase")
            return EatForceCase;
        else if (name == "instance")
            return EatInstance;
        else if (name == "maxtessfactor")
            return EatMaxTessFactor;
        else if (name == "maxvertexcount")
            return EatMaxVertexCount;
        else if (name == "numthreads")
            return EatNumThreads;
        else if (name == "outputcontrolpoints")
            return EatOutputControlPoints;
        else if (name == "outputtopology")
            return EatOutputTopology;
        else if (name == "partitioning")
            return EatPartitioning;
        else if (name == "patchconstantfunc")
            return EatPatchConstantFunc;
        else if (name == "unroll")
            return EatUnroll;
        else if (name == "loop")
            return EatLoop;
        else
            return EatNone;
    }